

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O3

void __thiscall QSqlCachedResult::detachFromResultSet(QSqlCachedResult *this)

{
  QSqlResultPrivate *pQVar1;
  
  pQVar1 = (this->super_QSqlResult).d_ptr;
  (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,0xffffffff);
  (*(this->super_QSqlResult)._vptr_QSqlResult[4])(this,0);
  QList<QVariant>::clear((QList<QVariant> *)(pQVar1 + 1));
  *(undefined1 *)&pQVar1[1].sql.d.d = 0;
  pQVar1[1].sqldriver.wp.value = (QObject *)0x0;
  return;
}

Assistant:

void QSqlCachedResult::detachFromResultSet()
{
    cleanup();
}